

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

IntBounds * __thiscall IntBounds::Clone(IntBounds *this)

{
  IntBounds *this_00;
  
  this_00 = (IntBounds *)
            new<Memory::JitArenaAllocator>
                      (0x80,(this->relativeLowerBounds).
                            super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            .alloc,0x3d6ef4);
  IntBounds(this_00,this);
  return this_00;
}

Assistant:

IntBounds *IntBounds::Clone() const
{
    JitArenaAllocator *const allocator = relativeLowerBounds.GetAllocator();
    return JitAnew(allocator, IntBounds, *this);
}